

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall HPresolve::removeImpliedFreeColumn(HPresolve *this,int col,int i,int k)

{
  int *piVar1;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  ostream *poVar7;
  reference pvVar8;
  vector<double,_std::allocator<double>_> *this_02;
  reference pvVar9;
  size_type __n;
  size_type __n_00;
  size_type __n_01;
  vector<double,_std::allocator<double>_> *this_03;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> newCosts;
  pair<int,_double> local_40;
  
  if (0 < this->iPrint) {
    poVar7 = std::operator<<((ostream *)&std::cout,"PR: Implied free column singleton ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,col);
    poVar7 = std::operator<<(poVar7," removed.  Row ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,i);
    poVar7 = std::operator<<(poVar7," removed.");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  piVar1 = (this->countRemovedCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 9;
  *piVar1 = *piVar1 + 1;
  piVar1 = (this->countRemovedRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 9;
  *piVar1 = *piVar1 + 1;
  newCosts.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  newCosts.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  newCosts.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &(this->super_HPreData).ARstart;
  pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_00,(long)i);
  __n_00 = (size_type)*pvVar8;
  this_01 = &(this->super_HPreData).flagCol;
  this_03 = &(this->super_HPreData).colCost;
  __n = (size_type)col;
  this_02 = &(this->super_HPreData).Avalue;
  while( true ) {
    pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_00,(long)(i + 1));
    if ((long)*pvVar8 <= (long)__n_00) break;
    pvVar8 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).ARindex,__n_00);
    iVar6 = *pvVar8;
    __n_01 = (size_type)iVar6;
    pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_01,__n_01);
    if ((iVar6 != col) && (*pvVar8 != 0)) {
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(this_03,__n_01);
      local_40.second = *pvVar9;
      local_40.first = iVar6;
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<std::pair<int,double>>
                ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)&newCosts,
                 &local_40);
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(this_03,__n_01);
      dVar2 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(this_03,__n);
      dVar3 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at
                         (&(this->super_HPreData).ARvalue,__n_00);
      dVar4 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(this_02,(long)k);
      dVar5 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(this_03,__n_01);
      *pvVar9 = dVar2 - (dVar3 * dVar4) / dVar5;
    }
    __n_00 = __n_00 + 1;
  }
  if (this->iKKTcheck == 1) {
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::push_back(&(this->super_HPreData).chk.costs.c,&newCosts);
  }
  pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_01,__n);
  *pvVar8 = 0;
  pvVar9 = std::vector<double,_std::allocator<double>_>::at(this_03,__n);
  std::deque<double,_std::allocator<double>_>::push_back(&(this->super_HPreData).postValue.c,pvVar9)
  ;
  fillStackRowBounds(this,i);
  pvVar9 = std::vector<double,_std::allocator<double>_>::at
                     (&(this->super_HPreData).valueColDual,__n);
  *pvVar9 = 0.0;
  pvVar9 = std::vector<double,_std::allocator<double>_>::at(this_03,__n);
  dVar2 = *pvVar9;
  pvVar9 = std::vector<double,_std::allocator<double>_>::at(this_02,(long)k);
  dVar3 = *pvVar9;
  pvVar9 = std::vector<double,_std::allocator<double>_>::at
                     (&(this->super_HPreData).valueRowDual,(long)i);
  *pvVar9 = -dVar2 / dVar3;
  addChange(this,9,i,col);
  removeRow(this,i);
  std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~_Vector_base
            (&newCosts.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>);
  return;
}

Assistant:

void HPresolve::removeImpliedFreeColumn(const int col, const int i, const int k) {
	if (iPrint > 0)
		cout << "PR: Implied free column singleton " << col << " removed.  Row "
				<< i << " removed." << endl;

	countRemovedCols[IMPLIED_FREE_SING_COL]++;
	countRemovedRows[IMPLIED_FREE_SING_COL]++;

	//modify costs
	int j;
	vector<pair<int, double> > newCosts;
	for (int kk = ARstart.at(i); kk < ARstart.at(i + 1); ++kk) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j != col) {
			newCosts.push_back(make_pair(j, colCost.at(j)));
			colCost.at(j) = colCost.at(j)
					- colCost.at(col) * ARvalue.at(kk) / Avalue.at(k);
		}
	}
	if (iKKTcheck == 1)
		chk.costs.push(newCosts);

	flagCol.at(col) = 0;
	postValue.push(colCost.at(col));
	fillStackRowBounds(i);

	valueColDual.at(col) = 0;
	valueRowDual.at(i) = -colCost.at(col) / Avalue.at(k);
	addChange(IMPLIED_FREE_SING_COL, i, col);
	removeRow(i);
}